

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void srclistRenumberCursors(Parse *pParse,int *aCsrMap,SrcList *pSrc,int iExcept)

{
  int iVar1;
  int iVar2;
  Select *pSVar3;
  int iVar4;
  SrcItem *pSVar5;
  
  if (0 < pSrc->nSrc) {
    pSVar5 = pSrc->a;
    iVar4 = 0;
    do {
      if (iVar4 != iExcept) {
        iVar1 = pSVar5->iCursor;
        if ((((pSVar5->fg).field_0x1 & 0x40) == 0) || (iVar2 = aCsrMap[(long)iVar1 + 1], iVar2 == 0)
           ) {
          iVar2 = pParse->nTab;
          pParse->nTab = iVar2 + 1;
          aCsrMap[(long)iVar1 + 1] = iVar2;
          iVar2 = aCsrMap[(long)pSVar5->iCursor + 1];
        }
        pSVar5->iCursor = iVar2;
        for (pSVar3 = pSVar5->pSelect; pSVar3 != (Select *)0x0; pSVar3 = pSVar3->pPrior) {
          srclistRenumberCursors(pParse,aCsrMap,pSVar3->pSrc,-1);
        }
      }
      iVar4 = iVar4 + 1;
      pSVar5 = pSVar5 + 1;
    } while (iVar4 < pSrc->nSrc);
  }
  return;
}

Assistant:

static void srclistRenumberCursors(
  Parse *pParse,                  /* Parse context */
  int *aCsrMap,                   /* Array to store cursor mappings in */
  SrcList *pSrc,                  /* FROM clause to renumber */
  int iExcept                     /* FROM clause item to skip */
){
  int i;
  SrcItem *pItem;
  for(i=0, pItem=pSrc->a; i<pSrc->nSrc; i++, pItem++){
    if( i!=iExcept ){
      Select *p;
      assert( pItem->iCursor < aCsrMap[0] );
      if( !pItem->fg.isRecursive || aCsrMap[pItem->iCursor+1]==0 ){
        aCsrMap[pItem->iCursor+1] = pParse->nTab++;
      }
      pItem->iCursor = aCsrMap[pItem->iCursor+1];
      for(p=pItem->pSelect; p; p=p->pPrior){
        srclistRenumberCursors(pParse, aCsrMap, p->pSrc, -1);
      }
    }
  }
}